

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O3

void __thiscall
solitaire::SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test::
~SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test
          (SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test *this)

{
  StrictMock<solitaire::archivers::SnapshotMock> *pSVar1;
  
  (this->super_SolitaireEmptyHandTest).super_SolitaireTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SolitaireEmptyHandTest_0031c810;
  if (((this->super_SolitaireEmptyHandTest).snapshotMock.isUniquePointerCreated == false) &&
     (pSVar1 = (this->super_SolitaireEmptyHandTest).snapshotMock.rawPointer,
     pSVar1 != (StrictMock<solitaire::archivers::SnapshotMock> *)0x0)) {
    (*(pSVar1->super_SnapshotMock).super_Snapshot._vptr_Snapshot[1])();
  }
  SolitaireTest::~SolitaireTest((SolitaireTest *)this);
  operator_delete(this,0x218);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryPullOutCardsFromTableauPile) {
    InSequence seq;
    expectSnapshotCreation(lastTableauPileMock, snapshotMock);
    EXPECT_CALL(lastTableauPileMock, tryPullOutCards(quantityToPullOut))
        .WillOnce(Return(twoCards));
    expectSavingSourcePileSnapshot(snapshotMock);

    solitaire.tryPullOutCardsFromTableauPile(lastTableauPileId, quantityToPullOut);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(twoCards));
}